

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O2

bool __thiscall QXmlUtils::isNCName(QXmlUtils *this,QStringView ncName)

{
  QChar QVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  if (this != (QXmlUtils *)0x0) {
    QVar1.ucs = *(char16_t *)ncName.m_size;
    bVar2 = isLetter(QVar1);
    if (((bVar2) || (QVar1.ucs == L'_')) || (QVar1.ucs == L':')) {
      lVar4 = 0;
      while( true ) {
        bVar2 = (long)this * 2 == lVar4;
        if (bVar2) {
          return bVar2;
        }
        QVar1.ucs = *(char16_t *)((long)ncName.m_size + lVar4);
        bVar3 = isNameChar(QVar1);
        if (!bVar3) break;
        lVar4 = lVar4 + 2;
        if (QVar1.ucs == L':') {
          return bVar2;
        }
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return size() == 0; }